

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_dnscache_add(Curl_easy *data,Curl_dns_entry *entry)

{
  Curl_hash *h;
  size_t sVar1;
  void *pvVar2;
  size_t idlen;
  char id [262];
  Curl_dnscache *dnscache;
  Curl_dns_entry *entry_local;
  Curl_easy *data_local;
  
  h = &dnscache_get(data)->entries;
  if (h == (Curl_hash *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    sVar1 = create_dnscache_id(entry->hostname,0,entry->hostport,(char *)&idlen,0x106);
    dnscache_lock(data,(Curl_dnscache *)h);
    pvVar2 = Curl_hash_add(h,&idlen,sVar1 + 1,entry);
    if (pvVar2 == (void *)0x0) {
      dnscache_unlock(data,(Curl_dnscache *)h);
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      entry->refcount = entry->refcount + 1;
      dnscache_unlock(data,(Curl_dnscache *)h);
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_dnscache_add(struct Curl_easy *data,
                           struct Curl_dns_entry *entry)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  char id[MAX_HOSTCACHE_LEN];
  size_t idlen;

  if(!dnscache)
    return CURLE_FAILED_INIT;
  /* Create an entry id, based upon the hostname and port */
  idlen = create_dnscache_id(entry->hostname, 0, entry->hostport,
                             id, sizeof(id));

  /* Store the resolved data in our DNS cache and up ref count */
  dnscache_lock(data, dnscache);
  if(!Curl_hash_add(&dnscache->entries, id, idlen + 1, (void *)entry)) {
    dnscache_unlock(data, dnscache);
    return CURLE_OUT_OF_MEMORY;
  }
  entry->refcount++;
  dnscache_unlock(data, dnscache);
  return CURLE_OK;
}